

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O3

void __thiscall Sandbox::onFileChange(Sandbox *this,WatchFileList *_files,int index)

{
  _Rb_tree_header *p_Var1;
  FileType FVar2;
  pointer pWVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  long *plVar9;
  long *plVar10;
  string filename;
  long *local_e0 [2];
  long local_d0 [2];
  long *local_c0;
  string local_b8;
  pointer local_98;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pWVar3 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
           super__Vector_impl_data._M_start;
  FVar2 = pWVar3[index].type;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  _Var4._M_p = pWVar3[index].path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,_Var4._M_p,_Var4._M_p + pWVar3[index].path._M_string_length);
  switch(FVar2) {
  case VERT_SHADER:
switchD_001b8852_caseD_1:
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_vert_source,0,(char *)(this->m_vert_source)._M_string_length,0x30762e
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->m_vert_dependencies,
                      (this->m_vert_dependencies).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar5 = vera::loadGlslFrom(&local_b8,&this->m_vert_source,&this->include_folders,
                               &this->m_vert_dependencies);
    goto LAB_001b8cd3;
  case IMAGE:
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_98 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
    p_Var7 = *(_Base_ptr *)
              ((long)&(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    p_Var1 = &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_c0 = *(long **)(p_Var7 + 2);
        (**(code **)(*local_c0 + 0x58))(&local_50);
        plVar10 = local_50;
        if (local_68 == local_48) {
          if (local_68 == 0) {
            bVar5 = true;
          }
          else {
            iVar6 = bcmp(local_70,local_50,local_68);
            bVar5 = iVar6 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (plVar10 != local_40) {
          operator_delete(plVar10,local_40[0] + 1);
        }
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
      } while ((!bVar5) &&
              (p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7),
              (_Rb_tree_header *)p_Var7 != p_Var1));
    }
    plVar9 = local_60;
    plVar10 = local_70;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reloading",9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_70,local_68);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      (**(code **)(**(long **)(p_Var7 + 2) + 0x20))
                (*(long **)(p_Var7 + 2),&local_70,local_98[index].vFlip,0,0);
      plVar10 = local_70;
    }
    goto LAB_001b8bdc;
  default:
    break;
  case CUBEMAP:
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_98 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
    p_Var7 = *(_Base_ptr *)
              ((long)&(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    p_Var1 = &(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_c0 = *(long **)(p_Var7 + 2);
        (**(code **)(*local_c0 + 0x58))(&local_50);
        plVar10 = local_50;
        if (local_88 == local_48) {
          if (local_88 == 0) {
            bVar5 = true;
          }
          else {
            iVar6 = bcmp(local_90,local_50,local_88);
            bVar5 = iVar6 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (plVar10 != local_40) {
          operator_delete(plVar10,local_40[0] + 1);
        }
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
      } while ((!bVar5) &&
              (p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7),
              (_Rb_tree_header *)p_Var7 != p_Var1));
    }
    plVar9 = local_80;
    plVar10 = local_90;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reloading",9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_90,local_88);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      (**(code **)(**(long **)(p_Var7 + 2) + 0x88))
                (*(long **)(p_Var7 + 2),&local_90,local_98[index].vFlip);
      plVar10 = local_90;
    }
LAB_001b8bdc:
    if (plVar10 != plVar9) {
      operator_delete(plVar10,*plVar9 + 1);
    }
    break;
  case GLSL_DEPENDENCY:
    bVar5 = onFileChange::anon_class_8_1_bc207785::operator()
                      ((anon_class_8_1_bc207785 *)&local_b8,
                       (StringList *)
                       (this->m_frag_dependencies).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (!bVar5) {
      bVar5 = onFileChange::anon_class_8_1_bc207785::operator()
                        ((anon_class_8_1_bc207785 *)&local_b8,
                         (StringList *)
                         (this->m_vert_dependencies).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (!bVar5) break;
      pWVar3 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var4._M_p = pWVar3[this->vert_index].path._M_dataplus._M_p;
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,_Var4._M_p,
                 _Var4._M_p + pWVar3[this->vert_index].path._M_string_length);
      local_c0 = (long *)CONCAT44(local_c0._4_4_,1);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)local_e0);
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      goto switchD_001b8852_caseD_1;
    }
    pWVar3 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
             super__Vector_impl_data._M_start;
    _Var4._M_p = pWVar3[this->frag_index].path._M_dataplus._M_p;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,_Var4._M_p,
               _Var4._M_p + pWVar3[this->frag_index].path._M_string_length);
    local_c0 = (long *)((ulong)local_c0 & 0xffffffff00000000);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)local_e0);
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
  case FRAG_SHADER:
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_frag_source,0,(char *)(this->m_frag_source)._M_string_length,0x30762e
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->m_frag_dependencies,
                      (this->m_frag_dependencies).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar5 = vera::loadGlslFrom(&local_b8,&this->m_frag_source,&this->include_folders,
                               &this->m_frag_dependencies);
LAB_001b8cd3:
    if (bVar5 != false) {
      resetShaders(this,_files);
    }
  }
  this->m_change = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Sandbox::onFileChange(WatchFileList &_files, int index) {
    FileType type = _files[index].type;
    std::string filename = _files[index].path;

    const auto reset_shaders = [&](std::string& source, vera::StringList& dependencies){
        source = "";
        dependencies.clear();
        if ( vera::loadGlslFrom(filename, &source, include_folders, &dependencies) )
            resetShaders(_files);
    };

    const auto dependency_matches_filename = [&](const vera::StringList& dependencies) {
        return std::any_of(std::begin(dependencies), std::end(dependencies), [&](const std::string& dependency){ return dependency == filename; });
    };

    // IF the change is on a dependency file, re route to the correct shader that need to be reload
    if (type == GLSL_DEPENDENCY) {
        using kv = std::tuple<FileType, std::string>;
        if (dependency_matches_filename(m_frag_dependencies)){
            std::tie(type, filename) = kv{FRAG_SHADER, _files[frag_index].path};
        } else if (dependency_matches_filename(m_vert_dependencies)){
            std::tie(type, filename) = kv{VERT_SHADER, _files[vert_index].path};
        }
    }
    switch(type) {
    case FRAG_SHADER:
        reset_shaders(m_frag_source, m_frag_dependencies);
        break;
    case VERT_SHADER:
        reset_shaders(m_vert_source, m_vert_dependencies);
        break;
    case GEOMETRY:
        // TODO
        break;
    case IMAGE:
        reload_uniforms(uniforms.textures, filename, _files[index]);
        break;
    case CUBEMAP:
        reload_uniforms(uniforms.cubemaps, filename, _files[index]);
        break;
    default: //'GLSL_DEPENDENCY' and 'IMAGE_BUMPMAP' not handled in switch
        break;
    }
    flagChange();
}